

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_ADC(void)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  Z80Reg ZVar5;
  Z80Reg ZVar6;
  char **ppcVar7;
  int local_58 [10];
  
  bVar2 = Options::IsLR35902;
  cVar1 = Options::IsI8080;
  do {
    local_58[4] = -1;
    local_58[5] = -1;
    local_58[6] = 0xffffffff;
    local_58[0] = -1;
    local_58[1] = -1;
    local_58[2] = 0xffffffff;
    local_58[3] = -1;
    ppcVar7 = (char **)0x88;
    bVar3 = CommonAluOpcode(0x88,local_58,true,false);
    if (!bVar3) {
      ZVar5 = GetRegister(ppcVar7);
      if (ZVar5 == Z80_UNK) {
        return;
      }
      ppcVar7 = &lp;
      bVar3 = comma(&lp);
      if (!bVar3) {
        Error("[ADC] Comma expected",(char *)0x0,PASS3);
        return;
      }
      ZVar6 = GetRegister(ppcVar7);
      if (((ZVar5 == Z80_HL) && (cVar1 == '\0')) && ((bVar2 & 1) == 0)) {
        if ((uint)(ZVar6 << 0x1c | (uint)(ZVar6 + ~(Z80_I|Z80_A)) >> 4) < 4) {
          local_58[1] = ZVar6 + (Z80_HL|Z80_F);
          local_58[0] = 0xed;
        }
      }
      else if (((ZVar5 == Z80_DE) &&
               ((uint)(ZVar6 << 0x1c | (uint)(ZVar6 + ~(Z80_I|Z80_A)) >> 4) < 4)) &&
              (bVar3 = Options::noFakes(true), !bVar3)) {
        ZVar5 = ZVar6 ^ Z80_BC;
        if ((ZVar6 & ~Z80_BC) != Z80_DE) {
          ZVar5 = ZVar6;
        }
        local_58[0] = 0xeb;
        local_58[1] = -2;
        local_58[2] = 0xed;
        local_58[3] = ZVar5 + (Z80_HL|Z80_F);
        local_58[4] = -2;
        local_58[5] = 0xeb;
      }
    }
    EmitBytes(local_58,true);
    cVar4 = (*DAT_0018a520)(&lp);
    if (cVar4 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_ADC() {
		const bool nonZ80CPU = Options::IsI8080 || Options::IsLR35902;
		Z80Reg reg, reg2;
		int reg2ex;
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1 };
			if (!CommonAluOpcode(0x88, e, true, false)) {	// handle common 8-bit variants
				reg = GetRegister(lp);	if (Z80_UNK == reg) break;
				if (!comma(lp)) {
					Error("[ADC] Comma expected");
					break;
				}
				reg2 = GetRegister(lp);
				if (Z80_HL == reg && !nonZ80CPU) {
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						e[0] = 0xed; e[1] = 0x4a + reg2 - Z80_BC; break;
					default: break;
					}
				} else if (Z80_DE == reg) {		// fake adc de,bc|de|hl|sp
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						if (Options::noFakes()) break;
						reg2ex = (Z80_DE == reg2 || Z80_HL == reg2) ? (reg2^0x10) : reg2;
						e[0] = 0xEB;
						e[1] = INSTRUCTION_START_MARKER; e[2] = 0xED; e[3] = 0x4A + reg2ex - Z80_BC;
						e[4] = INSTRUCTION_START_MARKER; e[5] = 0xEB;
						break;
					default: break;
					}
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}